

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O3

int ffbnfm(char *tform,int *dtcode,long *trepeat,long *twidth,int *status)

{
  int iVar1;
  size_t sVar2;
  ushort **ppuVar3;
  long lVar4;
  byte *pbVar5;
  int iVar6;
  byte *pbVar7;
  size_t sVar8;
  char *errmsg;
  byte *pbVar9;
  byte bVar10;
  long repeat;
  long width;
  char temp [71];
  long local_e0;
  long local_d8 [12];
  byte local_78 [72];
  
  if (0 < *status) {
    return *status;
  }
  if (dtcode != (int *)0x0) {
    *dtcode = 0;
  }
  if (trepeat != (long *)0x0) {
    *trepeat = 0;
  }
  if (twidth != (long *)0x0) {
    *twidth = 0;
  }
  sVar2 = strlen(tform);
  sVar8 = 0;
  if (sVar2 == 0) {
LAB_00133906:
    if (sVar2 != sVar8) {
      if (sVar2 - sVar8 < 0x47) {
        strcpy((char *)local_78,tform + sVar8);
        ffupch((char *)local_78);
        ppuVar3 = __ctype_b_loc();
        lVar4 = 1;
        pbVar7 = local_78;
        do {
          pbVar5 = pbVar7;
          bVar10 = *pbVar5;
          pbVar7 = pbVar5 + 1;
          lVar4 = lVar4 + -1;
        } while ((*(byte *)((long)*ppuVar3 + (long)(char)bVar10 * 2 + 1) & 8) != 0);
        if (lVar4 == 0) {
          local_e0 = 1;
        }
        else {
          iVar1 = __isoc99_sscanf(local_78,"%ld",&local_e0);
          if (iVar1 != 1) {
            errmsg = "Error: Bad repeat format in TFORM (ffbnfm).";
            goto LAB_00133a3d;
          }
          bVar10 = *pbVar5;
        }
        bVar10 = bVar10 & 0xfe;
        pbVar9 = pbVar5;
        if (bVar10 == 0x50) {
          pbVar9 = pbVar7;
        }
        switch(*pbVar9) {
        case 0x41:
          pbVar5 = pbVar5 + 2;
          if (bVar10 != 0x50) {
            pbVar5 = pbVar7;
          }
          if (*pbVar5 != 0) {
            if (*pbVar5 == 0x28) {
              pbVar9 = pbVar5;
            }
            iVar1 = __isoc99_sscanf(pbVar9 + 1,"%ld",local_d8);
            if ((iVar1 == 1) && ((iVar1 = 0x10, bVar10 == 0x50 || (local_d8[0] <= local_e0))))
            break;
          }
          local_d8[0] = local_e0;
          iVar1 = 0x10;
          break;
        case 0x42:
          local_d8[0] = 1;
          iVar1 = 0xb;
          break;
        case 0x43:
          local_d8[0] = 8;
          iVar1 = 0x53;
          break;
        case 0x44:
          local_d8[0] = 8;
          iVar1 = 0x52;
          break;
        case 0x45:
          local_d8[0] = 4;
          iVar1 = 0x2a;
          break;
        default:
          snprintf((char *)local_d8,0x51,"Illegal binary table TFORMn datatype: \'%s\' ",tform);
          ffxmsg(5,(char *)local_d8);
          *status = 0x106;
          return 0x106;
        case 0x49:
          local_d8[0] = 2;
          iVar1 = 0x15;
          break;
        case 0x4a:
          local_d8[0] = 4;
          iVar1 = 0x29;
          break;
        case 0x4b:
          local_d8[0] = 8;
          iVar1 = 0x51;
          break;
        case 0x4c:
          local_d8[0] = 1;
          iVar1 = 0xe;
          break;
        case 0x4d:
          local_d8[0] = 0x10;
          iVar1 = 0xa3;
          break;
        case 0x53:
          local_d8[0] = 1;
          iVar1 = 0xc;
          break;
        case 0x55:
          local_d8[0] = 2;
          iVar1 = 0x14;
          break;
        case 0x56:
          local_d8[0] = 4;
          iVar1 = 0x28;
          break;
        case 0x57:
          local_d8[0] = 8;
          iVar1 = 0x50;
          break;
        case 0x58:
          local_d8[0] = 1;
          iVar1 = 1;
        }
        if (dtcode != (int *)0x0) {
          iVar6 = -iVar1;
          if (bVar10 != 0x50) {
            iVar6 = iVar1;
          }
          *dtcode = iVar6;
        }
        if (trepeat != (long *)0x0) {
          *trepeat = local_e0;
        }
        if (twidth != (long *)0x0) {
          *twidth = local_d8[0];
        }
        return *status;
      }
      errmsg = "Error: binary table TFORM code is too long (ffbnfm).";
      goto LAB_00133a3d;
    }
  }
  else {
    do {
      if (tform[sVar8] != ' ') goto LAB_00133906;
      sVar8 = sVar8 + 1;
    } while (sVar2 != sVar8);
  }
  errmsg = "Error: binary table TFORM code is blank (ffbnfm).";
LAB_00133a3d:
  ffxmsg(5,errmsg);
  *status = 0x105;
  return 0x105;
}

Assistant:

int ffbnfm(char *tform,     /* I - format code from the TFORMn keyword */
           int *dtcode,   /* O - numerical datatype code */
           long *trepeat,    /* O - repeat count of the field  */
           long *twidth,     /* O - width of the field, in chars */
           int *status)     /* IO - error status      */
{
/*
  parse the binary table TFORM column format to determine the data
  type, repeat count, and the field width (if it is an ASCII (A) field)
*/
    size_t ii, nchar;
    int datacode, variable, iread;
    long width, repeat;
    char *form, temp[FLEN_VALUE], message[FLEN_ERRMSG];

    if (*status > 0)
        return(*status);

    if (dtcode)
        *dtcode = 0;

    if (trepeat)
        *trepeat = 0;

    if (twidth)
        *twidth = 0;

    nchar = strlen(tform);

    for (ii = 0; ii < nchar; ii++)
    {
        if (tform[ii] != ' ')     /* find first non-space char */
            break;
    }

    if (ii == nchar)
    {
        ffpmsg("Error: binary table TFORM code is blank (ffbnfm).");
        return(*status = BAD_TFORM);
    }

    if (nchar-ii > FLEN_VALUE-1)
    {
        ffpmsg("Error: binary table TFORM code is too long (ffbnfm).");
        return (*status = BAD_TFORM);
    }
    strcpy(temp, &tform[ii]); /* copy format string */
    ffupch(temp);     /* make sure it is in upper case */
    form = temp;      /* point to start of format string */

    /*-----------------------------------------------*/
    /*       get the repeat count                    */
    /*-----------------------------------------------*/

    ii = 0;
    while(isdigit((int) form[ii]))
        ii++;   /* look for leading digits in the field */

    if (ii == 0)
        repeat = 1;  /* no explicit repeat count */
    else
    {
        if (sscanf(form,"%ld", &repeat) != 1) /* read repeat count */
        {
           ffpmsg("Error: Bad repeat format in TFORM (ffbnfm).");
           return(*status = BAD_TFORM);
        }  
    }

    /*-----------------------------------------------*/
    /*             determine datatype code           */
    /*-----------------------------------------------*/

    form = form + ii;  /* skip over the repeat field */

    if (form[0] == 'P' || form[0] == 'Q')
    {
        variable = 1;  /* this is a variable length column */
/*        repeat = 1;  */ /* disregard any other repeat value */
        form++;        /* move to the next data type code char */
    }
    else
        variable = 0;

    if (form[0] == 'U')  /* internal code to signify unsigned short integer */
    { 
        datacode = TUSHORT;
        width = 2;
    }
    else if (form[0] == 'I')
    {
        datacode = TSHORT;
        width = 2;
    }
    else if (form[0] == 'V') /* internal code to signify unsigned integer */
    {
        datacode = TULONG;
        width = 4;
    }
    else if (form[0] == 'W') /* internal code to signify unsigned long long integer */
    {
        datacode = TULONGLONG;
        width = 8;
    }
    else if (form[0] == 'J')
    {
        datacode = TLONG;
        width = 4;
    }
    else if (form[0] == 'K')
    {
        datacode = TLONGLONG;
        width = 8;
    }
    else if (form[0] == 'E')
    {
        datacode = TFLOAT;
        width = 4;
    }
    else if (form[0] == 'D')
    {
        datacode = TDOUBLE;
        width = 8;
    }
    else if (form[0] == 'A')
    {
        datacode = TSTRING;

        /*
          the following code is used to support the non-standard
          datatype of the form rAw where r = total width of the field
          and w = width of fixed-length substrings within the field.
        */
        iread = 0;
        if (form[1] != 0)
        {
            if (form[1] == '(' )  /* skip parenthesis around */
                form++;          /* variable length column width */

            iread = sscanf(&form[1],"%ld", &width);
        }

        if (iread != 1 || (!variable && (width > repeat)) )
            width = repeat;
  
    }
    else if (form[0] == 'L')
    {
        datacode = TLOGICAL;
        width = 1;
    }
    else if (form[0] == 'X')
    {
        datacode = TBIT;
        width = 1;
    }
    else if (form[0] == 'B')
    {
        datacode = TBYTE;
        width = 1;
    }
    else if (form[0] == 'S') /* internal code to signify signed byte */
    {
        datacode = TSBYTE;
        width = 1;
    }
    else if (form[0] == 'C')
    {
        datacode = TCOMPLEX;
        width = 8;
    }
    else if (form[0] == 'M')
    {
        datacode = TDBLCOMPLEX;
        width = 16;
    }
    else
    {
        snprintf(message, FLEN_ERRMSG,
        "Illegal binary table TFORMn datatype: \'%s\' ", tform);
        ffpmsg(message);
        return(*status = BAD_TFORM_DTYPE);
    }

    if (variable)
        datacode = datacode * (-1); /* flag variable cols w/ neg type code */

    if (dtcode)
       *dtcode = datacode;

    if (trepeat)
       *trepeat = repeat;

    if (twidth)
       *twidth = width;

    return(*status);
}